

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_server_discovery.c
# Opt level: O0

pcp_errno psd_add_pcp_server(pcp_ctx_t *ctx,sockaddr *sa,uint8_t version)

{
  int pcp_server_index;
  pcp_errno pVar1;
  pcp_server_t *ppStack_48;
  int pcps_indx;
  pcp_server_t *pcps;
  uint16_t local_36;
  uint32_t scope_id;
  undefined4 uStack_30;
  uint16_t pcp_port;
  in6_addr pcp_ip;
  uint8_t version_local;
  sockaddr *sa_local;
  pcp_ctx_t *ctx_local;
  
  pcp_ip.__in6_u.__u6_addr8[0xb] = version;
  unique0x10000226 = sa;
  memset(&scope_id,0,0x10);
  pcps._4_4_ = 0;
  if (stack0xffffffffffffffe0->sa_family == 2) {
    scope_id = 0;
    uStack_30 = 0;
    pcp_ip.__in6_u.__u6_addr32[0] = htonl(0xffff);
    pcp_ip.__in6_u.__u6_addr32[1] = *(undefined4 *)(stack0xffffffffffffffe0->sa_data + 2);
    local_36 = *(uint16_t *)stack0xffffffffffffffe0->sa_data;
  }
  else {
    scope_id = *(uint32_t *)(stack0xffffffffffffffe0->sa_data + 6);
    uStack_30 = *(undefined4 *)(stack0xffffffffffffffe0->sa_data + 10);
    pcp_ip.__in6_u._0_2_ = stack0xffffffffffffffe0[1].sa_family;
    pcp_ip.__in6_u._2_1_ = stack0xffffffffffffffe0[1].sa_data[0];
    pcp_ip.__in6_u._3_1_ = stack0xffffffffffffffe0[1].sa_data[1];
    pcp_ip.__in6_u.__u6_addr32[1] = *(undefined4 *)(stack0xffffffffffffffe0[1].sa_data + 2);
    local_36 = *(uint16_t *)stack0xffffffffffffffe0->sa_data;
    pcps._4_4_ = *(uint32_t *)(stack0xffffffffffffffe0[1].sa_data + 6);
  }
  if (local_36 == 0) {
    local_36 = ntohs(0x14e7);
  }
  ppStack_48 = get_pcp_server_by_ip(ctx,(in6_addr *)&scope_id,pcps._4_4_);
  if (ppStack_48 == (pcp_server_t *)0x0) {
    pcp_server_index = pcp_new_server(ctx,(in6_addr *)&scope_id,local_36,pcps._4_4_);
    if (-1 < pcp_server_index) {
      ppStack_48 = get_pcp_server(ctx,pcp_server_index);
    }
    if (ppStack_48 == (pcp_server_t *)0x0) {
      pcp_logger(PCP_LOGLVL_ERR,"%s","Can\'t add PCP server.\n");
      return PCP_ERR_UNKNOWN;
    }
  }
  else {
    ppStack_48->pcp_port = local_36;
  }
  ppStack_48->pcp_version = pcp_ip.__in6_u.__u6_addr8[0xb];
  ppStack_48->server_state = pss_allocated;
  pVar1 = psd_fill_pcp_server_src(ppStack_48);
  if (pVar1 == PCP_ERR_SUCCESS) {
    pcp_logger(PCP_LOGLVL_INFO,"Added PCP server %s",ppStack_48->pcp_server_paddr);
    ctx_local._4_4_ = ppStack_48->index;
  }
  else {
    ppStack_48->server_state = pss_unitialized;
    pcp_logger(PCP_LOGLVL_INFO,"Failed to add PCP server %s",ppStack_48->pcp_server_paddr);
    ctx_local._4_4_ = PCP_ERR_UNKNOWN;
  }
  return ctx_local._4_4_;
}

Assistant:

pcp_errno psd_add_pcp_server(pcp_ctx_t *ctx, struct sockaddr *sa,
                             uint8_t version) {
    struct in6_addr pcp_ip = IN6ADDR_ANY_INIT;
    uint16_t pcp_port;
    uint32_t scope_id = 0;
    pcp_server_t *pcps = NULL;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (sa->sa_family == AF_INET) {
        S6_ADDR32(&pcp_ip)[0] = 0;
        S6_ADDR32(&pcp_ip)[1] = 0;
        S6_ADDR32(&pcp_ip)[2] = htonl(0xFFFF);
        S6_ADDR32(&pcp_ip)[3] = ((struct sockaddr_in *)sa)->sin_addr.s_addr;
        pcp_port = ((struct sockaddr_in *)sa)->sin_port;
    } else {
        IPV6_ADDR_COPY(&pcp_ip, &((struct sockaddr_in6 *)sa)->sin6_addr);
        pcp_port = ((struct sockaddr_in6 *)sa)->sin6_port;
        scope_id = ((struct sockaddr_in6 *)sa)->sin6_scope_id;
    }

    if (!pcp_port) {
        pcp_port = ntohs(PCP_SERVER_PORT);
    }

    pcps = get_pcp_server_by_ip(ctx, (struct in6_addr *)&pcp_ip, scope_id);
    if (!pcps) {
        int pcps_indx = pcp_new_server(ctx, &pcp_ip, pcp_port, scope_id);

        if (pcps_indx >= 0) {
            pcps = get_pcp_server(ctx, pcps_indx);
        }

        if (pcps == NULL) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s", "Can't add PCP server.\n");
            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return PCP_ERR_UNKNOWN;
        }
    } else {
        pcps->pcp_port = pcp_port;
    }

    pcps->pcp_version = version;
    pcps->server_state = pss_allocated;

    if (psd_fill_pcp_server_src(pcps)) {
        pcps->server_state = pss_unitialized;
        PCP_LOG(PCP_LOGLVL_INFO, "Failed to add PCP server %s",
                pcps->pcp_server_paddr);

        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return PCP_ERR_UNKNOWN;
    }

    PCP_LOG(PCP_LOGLVL_INFO, "Added PCP server %s", pcps->pcp_server_paddr);

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return (pcp_errno)pcps->index;
}